

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIntegrable.h
# Opt level: O2

void __thiscall
chrono::ChIntegrableIIorder::LoadConstraint_Ct
          (ChIntegrableIIorder *this,ChVectorDynamic<> *Qc,double c)

{
  ChException *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (ChException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_38,
             "LoadConstraint_Ct() not implemented, implicit integrators cannot be used. ",&local_39)
  ;
  ChException::ChException(this_00,&local_38);
  __cxa_throw(this_00,&ChException::typeinfo,ChException::~ChException);
}

Assistant:

virtual void LoadConstraint_Ct(ChVectorDynamic<>& Qc,  ///< result: the Qc residual, Qc += c*Ct
                                   const double c          ///< a scaling factor
                                   ) override {
        throw ChException("LoadConstraint_Ct() not implemented, implicit integrators cannot be used. ");
    }